

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Miner.cpp
# Opt level: O0

void __thiscall xmrig::MinerPrivate::handleJobChange(MinerPrivate *this)

{
  bool bVar1;
  reference ppIVar2;
  int in_EDX;
  char *in_RSI;
  Timer *in_RDI;
  IBackend *backend;
  iterator __end2;
  iterator __begin2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *__range2;
  vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
  local_18;
  Timer *local_10;
  
  *(undefined1 *)&in_RDI->m_listener = 1;
  if (((ulong)in_RDI->m_listener & 0x10000) != 0) {
    Job::index((Job *)(in_RDI + 1),in_RSI,in_EDX);
    Nonce::reset((uint8_t)((ulong)in_RDI >> 0x38));
  }
  local_10 = in_RDI + 0x12;
  local_18._M_current =
       (IBackend **)
       std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::begin
                 (in_stack_ffffffffffffffc8);
  std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>::end(in_stack_ffffffffffffffc8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_RDI,
                       (__normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
                        *)in_stack_ffffffffffffffc8);
    if (!bVar1) break;
    ppIVar2 = __gnu_cxx::
              __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
              ::operator*(&local_18);
    (*(*ppIVar2)->_vptr_IBackend[9])(*ppIVar2,in_RDI + 1);
    __gnu_cxx::
    __normal_iterator<xmrig::IBackend_**,_std::vector<xmrig::IBackend_*,_std::allocator<xmrig::IBackend_*>_>_>
    ::operator++(&local_18);
  }
  Nonce::touch();
  if (((ulong)in_RDI->m_listener & 0x100) != 0) {
    Nonce::pause((Nonce *)0x0);
  }
  if (in_RDI[0x15].m_listener == (ITimerListener *)0x0) {
    in_RDI[0x15].m_listener =
         (ITimerListener *)((long)&(in_RDI[0x15].m_listener)->_vptr_ITimerListener + 1);
    Timer::start(in_RDI,(uint64_t)in_stack_ffffffffffffffc8,0x2311d8);
  }
  return;
}

Assistant:

inline void handleJobChange()
    {
        active = true;

        if (reset) {
            Nonce::reset(job.index());
        }

        for (IBackend *backend : backends) {
            backend->setJob(job);
        }

        Nonce::touch();

        if (enabled) {
            Nonce::pause(false);;
        }

        if (ticks == 0) {
            ticks++;
            timer->start(500, 500);
        }
    }